

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

void __thiscall DFATest_ChainZip_Test::~DFATest_ChainZip_Test(DFATest_ChainZip_Test *this)

{
  DFATest_ChainZip_Test *this_local;
  
  ~DFATest_ChainZip_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DFATest, ChainZip) {
  // Chain A->B->C->D is identical to chain W->X->Y->Z.
  State a{"A", {"B"}}, w{"W", {"X"}};
  State b{"B", {"C"}}, x{"X", {"Y"}};
  State c{"C", {"D"}}, y{"Y", {"Z"}};
  State d{"D", {}}, z{"Z", {}};
  Graph graph = {{a, b, c, d, w, x, y, z}};
  auto results = DFA::refinePartitions(graph);
  validate(graph, results);
  EXPECT_EQ(settify(results),
            (SetResults{{"A", "W"}, {"B", "X"}, {"C", "Y"}, {"D", "Z"}}));
}